

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_fare_attributes.c
# Opt level: O0

greatest_test_res fare_attributes_compare(void)

{
  int iVar1;
  undefined1 local_1f0 [8];
  fare_attributes_t c;
  fare_attributes_t b;
  fare_attributes_t a;
  
  memcpy(&b.transfer_duration,"SOME_ID1",0xa0);
  memcpy(&c.transfer_duration,"SOME_ID1",0xa0);
  memcpy(local_1f0,"SOME_ID1",0xa0);
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = equal_fare_attributes
                    ((fare_attributes_t *)&b.transfer_duration,
                     (fare_attributes_t *)&c.transfer_duration);
  if (iVar1 == 1) {
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_fare_attributes
                      ((fare_attributes_t *)&b.transfer_duration,(fare_attributes_t *)local_1f0);
    if (iVar1 == 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_fare_attributes
                        ((fare_attributes_t *)&c.transfer_duration,(fare_attributes_t *)local_1f0);
      if (iVar1 == 0) {
        greatest_info.msg = (char *)0x0;
        a.transfer_duration._4_4_ = GREATEST_TEST_RES_PASS;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
        ;
        greatest_info.fail_line = 0x3f;
        greatest_info.msg = "0 != equal_fare_attributes(&b, &c)";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        a.transfer_duration._4_4_ = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
      ;
      greatest_info.fail_line = 0x3e;
      greatest_info.msg = "0 != equal_fare_attributes(&a, &c)";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      a.transfer_duration._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_attributes.c"
    ;
    greatest_info.fail_line = 0x3d;
    greatest_info.msg = "1 != equal_fare_attributes(&a, &b)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    a.transfer_duration._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  return a.transfer_duration._4_4_;
}

Assistant:

TEST fare_attributes_compare(void) {
    fare_attributes_t a = {
        .fare_id = "SOME_ID1",
        .currency_type = "EUR",
        .price = 10.0,
        .payment_method = PM_NOT_SET,
        .transfers = TS_UNLIMITED,
        .transfer_duration = 60.0
    };

    fare_attributes_t b = {
        .fare_id = "SOME_ID1",
        .currency_type = "EUR",
        .price = 10.0,
        .payment_method = PM_NOT_SET,
        .transfers = TS_UNLIMITED,
        .transfer_duration = 60.0
    };

    fare_attributes_t c = {
        .fare_id = "SOME_ID1",
        .currency_type = "EUR",
        .agency_id = "ANOTHER_ID",
        .price = 9.0,
        .payment_method = PM_NOT_SET,
        .transfers = TS_UNLIMITED,
        .transfer_duration = 60.0
    };

    ASSERT_EQ(1, equal_fare_attributes(&a, &b));
    ASSERT_EQ(0, equal_fare_attributes(&a, &c));
    ASSERT_EQ(0, equal_fare_attributes(&b, &c));

    PASS();
}